

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_value-c.cpp
# Opt level: O2

char * duckdb_value_to_string(duckdb_value val)

{
  char *__dest;
  string str;
  Value v;
  string local_78;
  Value local_58;
  
  if (val == (duckdb_value)0x0) {
    __dest = (char *)0x0;
  }
  else {
    duckdb::Value::Value(&local_58,(Value *)val);
    duckdb::Value::ToSQLString_abi_cxx11_(&local_78,&local_58);
    __dest = (char *)malloc(local_78._M_string_length + 1);
    switchD_016b0717::default(__dest,local_78._M_dataplus._M_p,local_78._M_string_length);
    __dest[local_78._M_string_length] = '\0';
    std::__cxx11::string::~string((string *)&local_78);
    duckdb::Value::~Value(&local_58);
  }
  return __dest;
}

Assistant:

char *duckdb_value_to_string(duckdb_value val) {
	if (!val) {
		return nullptr;
	}

	auto v = UnwrapValue(val);
	auto str = v.ToSQLString();

	auto result = reinterpret_cast<char *>(malloc(sizeof(char) * (str.size() + 1)));
	memcpy(result, str.c_str(), str.size());
	result[str.size()] = '\0';
	return result;
}